

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O0

void __thiscall
ExampleNLFeeder::
FeedConBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ConBndWriter>
          (ExampleNLFeeder *this,ConBndWriter *cbw)

{
  AlgConRange acr;
  ExampleModel *pEVar1;
  ExampleNLFeeder *in_RDI;
  AlgConRange bnd;
  int j;
  undefined1 in_stack_ffffffffffffffa0 [12];
  int iVar2;
  AlgConRange local_30;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    iVar2 = local_14;
    Model(in_RDI);
    if (2 < iVar2) break;
    mp::NLFeeder<ExampleModel,_void_*>::AlgConRange::AlgConRange(&local_30);
    pEVar1 = Model(in_RDI);
    local_30.L = pEVar1->con_lb[local_14];
    pEVar1 = Model(in_RDI);
    local_30.U = pEVar1->con_ub[local_14];
    acr.U._4_4_ = iVar2;
    acr._0_12_ = in_stack_ffffffffffffffa0;
    acr._16_8_ = in_RDI;
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ConBndWriter::
    WriteAlgConRange<mp::NLFeeder<ExampleModel,void*>::AlgConRange>((ConBndWriter *)local_30.U,acr);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void FeedConBounds(ConBoundsWriter& cbw) {
    for (int j=0; j<Model().n_con; j++) {
      AlgConRange bnd;
      bnd.L = Model().con_lb[j];
      bnd.U = Model().con_ub[j];
      cbw.WriteAlgConRange(bnd);
    }
  }